

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O0

void bool_linear(vec<BoolView> *x,IntRelType t,IntVar *y)

{
  IntView<0> _y;
  IntView<5> _y_00;
  IntView<0> _y_01;
  IntView<4> _y_02;
  IntView<5> _y_03;
  IntView<5> _y_04;
  uint uVar1;
  uint uVar2;
  IntVar *pIVar3;
  char *pcVar4;
  IntVar *in_RDX;
  uint in_ESI;
  vec<BoolView> *in_RDI;
  uint i;
  vec<BoolView> x2;
  vec<BoolView> *in_stack_fffffffffffffeb0;
  BoolView *in_stack_fffffffffffffeb8;
  FILE *__stream;
  vec<BoolView> *in_stack_fffffffffffffec0;
  vec<BoolView> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  IntVar *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  IntView<5> local_b0;
  IntView<5> local_a0;
  IntView<4> local_90;
  IntView<0> local_80;
  IntView<5> local_70;
  IntView<0> local_60 [3];
  uint local_2c;
  vec<BoolView> local_28;
  IntVar *local_18;
  uint local_c;
  vec<BoolView> *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  vec<BoolView>::vec(&local_28);
  for (local_2c = 0; uVar2 = local_2c, uVar1 = vec<BoolView>::size(local_8), uVar2 < uVar1;
      local_2c = local_2c + 1) {
    vec<BoolView>::operator[](local_8,local_2c);
    operator~(in_stack_fffffffffffffeb8);
    vec<BoolView>::push(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    BoolView::~BoolView((BoolView *)0x190669);
  }
  switch(local_c) {
  case 0:
    operator_new(0x50);
    IntView<0>::IntView(local_60,local_18,1,0);
    _y.a = (int)in_stack_fffffffffffffef0;
    _y.b = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    _y.var = in_stack_fffffffffffffee8;
    BoolLinearLE<0>::BoolLinearLE
              ((BoolLinearLE<0> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,_y);
    operator_new(0x50);
    uVar2 = vec<BoolView>::size(local_8);
    IntView<5>::IntView(&local_70,local_18,1,uVar2);
    _y_00.a = (int)in_stack_fffffffffffffef0;
    _y_00.b = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    _y_00.var = in_stack_fffffffffffffee8;
    BoolLinearLE<5>::BoolLinearLE
              ((BoolLinearLE<5> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,_y_00);
    break;
  default:
    __stream = _stderr;
    pcVar4 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/linear-bool.cpp"
                     ,0x2f);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/linear-bool.cpp"
      ;
    }
    else {
      pcVar4 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/globals/linear-bool.cpp"
                       ,0x2f);
      pcVar4 = pcVar4 + 1;
    }
    fprintf(__stream,"%s:%d: ",pcVar4,0x6a);
    fprintf(_stderr,"Unknown IntRelType %d\n",(ulong)local_c);
    abort();
  case 2:
    operator_new(0x50);
    IntView<0>::IntView(&local_80,local_18,1,0);
    _y_01.a = (int)in_stack_fffffffffffffef0;
    _y_01.b = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    _y_01.var = in_stack_fffffffffffffee8;
    BoolLinearLE<0>::BoolLinearLE
              ((BoolLinearLE<0> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,_y_01);
    break;
  case 3:
    operator_new(0x50);
    IntView<4>::IntView(&local_90,local_18,1,-1);
    _y_02._8_8_ = local_8;
    _y_02.var = in_stack_fffffffffffffee8;
    BoolLinearLE<4>::BoolLinearLE
              ((BoolLinearLE<4> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,_y_02);
    break;
  case 4:
    pIVar3 = (IntVar *)operator_new(0x50);
    uVar2 = vec<BoolView>::size(local_8);
    IntView<5>::IntView(&local_a0,local_18,1,uVar2);
    _y_03.a = (int)in_stack_fffffffffffffef0;
    _y_03.b = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    _y_03.var = pIVar3;
    BoolLinearLE<5>::BoolLinearLE
              ((BoolLinearLE<5> *)CONCAT44(uVar2,in_stack_fffffffffffffee0),
               (vec<BoolView> *)local_18,_y_03);
    break;
  case 5:
    operator_new(0x50);
    uVar2 = vec<BoolView>::size(local_8);
    IntView<5>::IntView(&local_b0,local_18,1,uVar2 - 1);
    _y_04.a = (int)in_stack_fffffffffffffef0;
    _y_04.b = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    _y_04.var = in_stack_fffffffffffffee8;
    BoolLinearLE<5>::BoolLinearLE
              ((BoolLinearLE<5> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,_y_04);
  }
  vec<BoolView>::~vec(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void bool_linear(vec<BoolView>& x, IntRelType t, IntVar* y) {
	vec<BoolView> x2;
	for (unsigned int i = 0; i < x.size(); i++) {
		x2.push(~x[i]);
	}
	switch (t) {
		case IRT_EQ:
			// sum x_i = y <=> sum x_i <= y /\ sum (1-x_i) <= (-y+x.size())
			new BoolLinearLE<0>(x, IntView<0>(y));
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size()));
			break;
		case IRT_LE:
			// sum x_i <= y
			new BoolLinearLE<0>(x, IntView<0>(y));
			break;
		case IRT_LT:
			// sum x_i < y <=> sum x_i <= (y-1)
			new BoolLinearLE<4>(x, IntView<4>(y, 1, -1));
			break;
		case IRT_GE:
			// sum x_i >= y <=> sum (1-x_i) <= (-y+x.size())
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size()));
			break;
		case IRT_GT:
			// sum x_i > y <=> sum (1-x_i) <= (-y+x.size()-1)
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size() - 1));
			break;
		default:
			CHUFFED_ERROR("Unknown IntRelType %d\n", t);
	}
}